

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O1

size_t __thiscall StressTester::GetRandomSize(StressTester *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  iVar3 = PAL_rand();
  sVar5 = (size_t)(uint)(iVar3 % 5);
  switch(sVar5) {
  case 0:
    goto switchD_0075c2c1_caseD_0;
  case 1:
    uVar4 = PAL_rand();
    uVar7 = uVar4 + 0xf;
    if (-1 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 & 0xfffffff0;
    break;
  case 2:
    uVar4 = PAL_rand();
    uVar7 = uVar4 + 0xfff;
    if (-1 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 & 0xfffff000;
    break;
  case 3:
    uVar4 = PAL_rand();
    uVar7 = uVar4 + 0x3fff;
    if (-1 < (int)uVar4) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 & 0xffffc000;
    break;
  case 4:
    iVar3 = PAL_rand();
    return (long)iVar3;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/StressTest.cpp"
                       ,0xba,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    sVar5 = 0;
    goto switchD_0075c2c1_caseD_0;
  }
  sVar5 = (size_t)(int)(uVar4 - uVar7);
switchD_0075c2c1_caseD_0:
  return sVar5;
}

Assistant:

size_t StressTester::GetRandomSize()
{
    int i = rand() % 5;
    switch (i)
    {
    case 0: return 0;
    case 1: return rand() % 16;
    case 2: return rand() % 4096;
    case 3: return rand() % 16384;
    case 4: return rand();
    default:
        Assert(false);
        return 0;
    }
}